

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

bool __thiscall xmrig::Client::isCriticalError(Client *this,char *message)

{
  int iVar1;
  bool bVar2;
  
  if (message == (char *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = strncasecmp(message,"Unauthenticated",0xf);
    bVar2 = true;
    if (iVar1 != 0) {
      iVar1 = strncasecmp(message,"your IP is banned",0x11);
      if (iVar1 != 0) {
        iVar1 = strncasecmp(message,"IP Address currently banned",0x1b);
        bVar2 = iVar1 == 0;
      }
    }
  }
  return bVar2;
}

Assistant:

bool xmrig::Client::isCriticalError(const char *message)
{
    if (!message) {
        return false;
    }

    if (strncasecmp(message, "Unauthenticated", 15) == 0) {
        return true;
    }

    if (strncasecmp(message, "your IP is banned", 17) == 0) {
        return true;
    }

    if (strncasecmp(message, "IP Address currently banned", 27) == 0) {
        return true;
    }

    return false;
}